

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::arraySizeCheck
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *expr,TArraySize *sizePair)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  uint *puVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar4;
  
  sizePair->size = 1;
  sizePair->node = (TIntermTyped *)0x0;
  iVar2 = (*(expr->super_TIntermNode)._vptr_TIntermNode[5])(expr);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    iVar2 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x21])(expr);
    if ((*(byte *)(CONCAT44(extraout_var_00,iVar2) + 0xc) & 1) != 0) {
      sizePair->node = expr;
      iVar2 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0xc])(expr);
      if (((CONCAT44(extraout_var_01,iVar2) != 0) &&
          (lVar1 = *(long *)(CONCAT44(extraout_var_01,iVar2) + 0x128), lVar1 != 0)) &&
         (puVar3 = *(uint **)(lVar1 + 8),
         0 < (int)((ulong)(*(long *)(lVar1 + 0x10) - (long)puVar3) >> 4))) goto LAB_00322d48;
      goto LAB_00322d4d;
    }
  }
  else {
    puVar3 = *(uint **)(*(long *)(CONCAT44(extraout_var,iVar2) + 0xc0) + 8);
LAB_00322d48:
    sizePair->size = *puVar3;
LAB_00322d4d:
    iVar2 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(expr);
    if ((iVar2 == 8) ||
       (iVar2 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(expr), iVar2 == 9)) {
      if (sizePair->size != 0) {
        return;
      }
      pcVar4 = "array size must be a positive integer";
      goto LAB_00322da6;
    }
  }
  pcVar4 = "array size must be a constant integer expression";
LAB_00322da6:
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar4,"","",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void HlslParseContext::arraySizeCheck(const TSourceLoc& loc, TIntermTyped* expr, TArraySize& sizePair)
{
    bool isConst = false;
    sizePair.size = 1;
    sizePair.node = nullptr;

    TIntermConstantUnion* constant = expr->getAsConstantUnion();
    if (constant) {
        // handle true (non-specialization) constant
        sizePair.size = constant->getConstArray()[0].getIConst();
        isConst = true;
    } else {
        // see if it's a specialization constant instead
        if (expr->getQualifier().isSpecConstant()) {
            isConst = true;
            sizePair.node = expr;
            TIntermSymbol* symbol = expr->getAsSymbolNode();
            if (symbol && symbol->getConstArray().size() > 0)
                sizePair.size = symbol->getConstArray()[0].getIConst();
        }
    }

    if (! isConst || (expr->getBasicType() != EbtInt && expr->getBasicType() != EbtUint)) {
        error(loc, "array size must be a constant integer expression", "", "");
        return;
    }

    if (sizePair.size <= 0) {
        error(loc, "array size must be a positive integer", "", "");
        return;
    }
}